

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

uint __thiscall ON_SubDVertex::MinimumFaceEdgeCount(ON_SubDVertex *this)

{
  ushort uVar1;
  ushort uVar2;
  ulong uVar3;
  
  if ((ulong)this->m_face_count != 0) {
    uVar3 = 0;
    uVar1 = 0xffff;
    do {
      uVar2 = uVar1;
      if ((this->m_faces[uVar3] != (ON_SubDFace *)0x0) &&
         (uVar2 = this->m_faces[uVar3]->m_edge_count, uVar1 <= uVar2)) {
        uVar2 = uVar1;
      }
      uVar3 = uVar3 + 1;
      uVar1 = uVar2;
    } while (this->m_face_count != uVar3);
    if (uVar2 != 0xffff) goto LAB_005c7af3;
  }
  uVar2 = 0;
LAB_005c7af3:
  return (uint)uVar2;
}

Assistant:

unsigned int ON_SubDVertex::MinimumFaceEdgeCount() const
{
  unsigned short min_count = 0xFFFFU;
  for (unsigned short vfi = 0; vfi < m_face_count; ++vfi)
  {
    const ON_SubDFace* f = m_faces[vfi];
    if (nullptr != f && f->m_edge_count < min_count)
      min_count = f->m_edge_count;
  }
  return min_count < 0xFFFFU ? min_count : 0;
}